

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode add_next_timeout(curltime now,Curl_multi *multi,Curl_easy *d)

{
  curl_llist *list;
  void *pvVar1;
  curl_llist_element *pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  timediff_t tVar6;
  curl_llist_element *e;
  curltime older;
  curltime newer;
  curltime i;
  
  e = (d->state).timeoutlist.head;
  if (e != (curl_llist_element *)0x0) {
    list = &(d->state).timeoutlist;
    do {
      pvVar1 = e->ptr;
      pcVar2 = e->next;
      older._8_8_ = now._8_8_ & 0xffffffff;
      older.tv_sec = now.tv_sec;
      newer._12_4_ = 0;
      newer._0_12_ = *(undefined1 (*) [12])((long)pvVar1 + 0x18);
      tVar6 = Curl_timediff(newer,older);
      if (0 < tVar6) break;
      Curl_llist_remove(list,e,(void *)0x0);
      e = pcVar2;
    } while (pcVar2 != (curl_llist_element *)0x0);
    if (list->head != (curl_llist_element *)0x0) {
      uVar5 = *(undefined8 *)((long)pvVar1 + 0x20);
      (d->state).expiretime.tv_sec = *(time_t *)((long)pvVar1 + 0x18);
      *(undefined8 *)&(d->state).expiretime.tv_usec = uVar5;
      uVar3 = (d->state).expiretime.tv_sec;
      uVar4 = (d->state).expiretime.tv_usec;
      i.tv_usec = uVar4;
      i.tv_sec = uVar3;
      i._12_4_ = 0;
      d = (Curl_easy *)Curl_splayinsert(i,multi->timetree,&(d->state).timenode);
      multi->timetree = (Curl_tree *)d;
      goto LAB_00415fd6;
    }
  }
  (d->state).expiretime.tv_sec = 0;
  (d->state).expiretime.tv_usec = 0;
LAB_00415fd6:
  return (CURLMcode)d;
}

Assistant:

static CURLMcode add_next_timeout(struct curltime now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct curltime *tv = &d->state.expiretime;
  struct curl_llist *list = &d->state.timeoutlist;
  struct curl_llist_element *e;
  struct time_node *node = NULL;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct curl_llist_element *n = e->next;
    timediff_t diff;
    node = (struct time_node *)e->ptr;
    diff = Curl_timediff(node->time, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, &node->time, sizeof(*tv));

    /* Insert this node again into the splay.  Keep the timer in the list in
       case we need to recompute future timers. */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}